

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_ps_writelist(stb_ps *ps,void **list,int size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  switch((uint)ps & 3) {
  case 0:
    if (0 < size && ps != (stb_ps *)0x0) {
      *list = ps;
      return 1;
    }
    break;
  case 1:
    iVar1 = 0;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      if (iVar1 < size && *(void **)(ps + lVar5 * 8 + -1) != (void *)0x0) {
        lVar4 = (long)iVar1;
        iVar1 = iVar1 + 1;
        list[lVar4] = *(void **)(ps + lVar5 * 8 + -1);
      }
    }
    return iVar1;
  case 2:
    if (*(int *)(ps + -2) < size) {
      size = *(int *)(ps + -2);
    }
    memcpy(list,ps + 6,(long)size << 3);
    return size;
  case 3:
    if (0 < size) {
      uVar3 = 0;
      uVar2 = (ulong)*(uint *)(ps + 5);
      if ((int)*(uint *)(ps + 5) < 1) {
        uVar2 = uVar3;
      }
      iVar1 = 0;
      do {
        if (uVar2 == uVar3) {
          return iVar1;
        }
        if (((ulong)*(void **)(ps + uVar3 * 8 + 0x1d) & 0xfffffffe) != 0) {
          lVar5 = (long)iVar1;
          iVar1 = iVar1 + 1;
          list[lVar5] = *(void **)(ps + uVar3 * 8 + 0x1d);
          if (iVar1 == size) {
            return size;
          }
        }
        uVar3 = uVar3 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

int stb_ps_writelist(stb_ps *ps, void **list, int size )
{
   int i,n=0;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL || size <= 0) return 0;
         list[0] = ps;
         return 1;
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL && n < size)
               list[n++] = b->p[i];
         return n;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         n = stb_min(size, a->count);
         memcpy(list, a->p, sizeof(*list) * n);
         return n;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         if (size <= 0) return 0;
         for (i=0; i < h->count; ++i) {
            if (!stb_ps_empty(h->table[i])) {
               list[n++] = h->table[i];
               if (n == size) break;
            }
         }
         return n;
      }
   }
   return 0; /* NOTREACHED */
}